

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_dft.hpp
# Opt level: O0

void __thiscall SlidingDFT<float,_64UL>::SlidingDFT(SlidingDFT<float,_64UL> *this)

{
  double dVar1;
  _ComplexT extraout_XMM0_Qa;
  undefined4 uVar2;
  undefined4 uVar3;
  float local_a4;
  complex<float> *local_90;
  complex<float> *local_78;
  complex<float> *local_60;
  float *local_48;
  complex<float> local_3c [2];
  float local_2c;
  ulong uStack_28;
  float factor;
  size_t k;
  float N;
  complex<float> j;
  SlidingDFT<float,_64UL> *this_local;
  
  this->data_valid = false;
  this->x[0] = 0.0;
  local_48 = this->x + 1;
  do {
    *local_48 = 0.0;
    local_48 = local_48 + 1;
  } while (local_48 != (float *)&this->field_0x104);
  this->x_index = 0;
  local_60 = this->twiddle;
  j._M_value = (_ComplexT)this;
  do {
    std::complex<float>::complex(local_60,0.0,0.0);
    local_60 = local_60 + 1;
  } while (local_60 != this->S);
  local_78 = this->S;
  do {
    std::complex<float>::complex(local_78,0.0,0.0);
    local_78 = local_78 + 1;
  } while (local_78 != this->dft);
  local_90 = this->dft;
  do {
    uVar2 = 0;
    uVar3 = 0;
    std::complex<float>::complex(local_90,0.0,0.0);
    local_90 = local_90 + 1;
  } while (local_90 != (complex<float> *)&this->damping_factor);
  dVar1 = std::nexttoward(5.26354424712089e-315,(double)CONCAT44(uVar3,uVar2));
  this->damping_factor = SUB84(dVar1,0);
  std::complex<float>::complex((complex<float> *)&stack0xffffffffffffffe8,0.0,1.0);
  k._4_4_ = 0x42800000;
  for (uStack_28 = 0; uStack_28 < 0x40; uStack_28 = uStack_28 + 1) {
    local_a4 = (float)uStack_28;
    local_2c = local_a4 * 6.2831855 * 0.015625;
    std::operator*((complex<float> *)&stack0xffffffffffffffe8,&local_2c);
    std::exp<float>(local_3c);
    this->twiddle[uStack_28]._M_value = extraout_XMM0_Qa;
    std::complex<float>::operator=(this->S + uStack_28,0.0);
    this->x[uStack_28] = 0.0;
  }
  return;
}

Assistant:

SlidingDFT()
	{
		const std::complex<NumberFormat> j(0.0, 1.0);
		const NumberFormat N = DFT_Length;

		// Compute the twiddle factors, and zero the x and S arrays
		for (size_t k = 0; k < DFT_Length; k++) {
			NumberFormat factor = (NumberFormat)(2.0 * M_PI) * k / N;
			this->twiddle[k] = std::exp(j * factor);
			this->S[k] = 0;
			this->x[k] = 0;
		}
	}